

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

void aura_buffer_release(aura_buffer *buf)

{
  aura_node *node;
  list_head *plVar1;
  
  node = buf->owner;
  if (buf->magic == 0xdeadc0de) {
    plVar1 = (node->buffer_pool).next;
    plVar1->prev = &buf->qentry;
    (buf->qentry).next = plVar1;
    (buf->qentry).prev = &node->buffer_pool;
    (node->buffer_pool).next = &buf->qentry;
    node->num_buffers_in_pool = node->num_buffers_in_pool + 1;
    return;
  }
  BUG(node,"FATAL: Attempting to release a buffer with invalid magic OR double free an aura_buffer")
  ;
}

Assistant:

void aura_buffer_release(struct aura_buffer *buf)
{
	/* Just put the buffer back into the pool at the very start */
#ifdef AURA_USE_BUFFER_POOL
	struct aura_node *nd = buf->owner;
	if (buf->magic != AURA_BUFFER_MAGIC_ID)
		BUG(nd,
		    "FATAL: Attempting to release a buffer with invalid magic OR double free an aura_buffer");

	list_add(&buf->qentry, &nd->buffer_pool);
	nd->num_buffers_in_pool++;
#else
	aura_buffer_destroy(buf);
#endif
}